

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O2

Expression * __thiscall
wasm::MultiMemoryLowering::Replacer::makeAddGtuTrap
          (Replacer *this,Expression *leftOperand,Expression *rightOperand,Expression *limit)

{
  Builder *this_00;
  BinaryOp op;
  BinaryOp op_00;
  Binary *pBVar1;
  Expression *ifTrue;
  If *pIVar2;
  
  this_00 = &this->builder;
  op = Abstract::getBinary((Type)(this->parent->pointerType).id,GtU);
  op_00 = Abstract::getBinary((Type)(this->parent->pointerType).id,Add);
  pBVar1 = Builder::makeBinary(this_00,op_00,leftOperand,rightOperand);
  pBVar1 = Builder::makeBinary(this_00,op,(Expression *)pBVar1,limit);
  ifTrue = (Expression *)Builder::makeUnreachable(this_00);
  pIVar2 = Builder::makeIf(this_00,(Expression *)pBVar1,ifTrue,(Expression *)0x0);
  return (Expression *)pIVar2;
}

Assistant:

Expression* makeAddGtuTrap(Expression* leftOperand,
                               Expression* rightOperand,
                               Expression* limit) {
      Expression* gtuTrap = builder.makeIf(
        builder.makeBinary(
          Abstract::getBinary(parent.pointerType, Abstract::GtU),
          builder.makeBinary(
            Abstract::getBinary(parent.pointerType, Abstract::Add),
            leftOperand,
            rightOperand),
          limit),
        builder.makeUnreachable());
      return gtuTrap;
    }